

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeTessellationTests.cpp
# Opt level: O2

void deqp::gles31::Functional::NegativeTestShared::invalid_patch_parameteri
               (NegativeTestContext *ctx)

{
  int maxPatchVertices;
  allocator<char> local_29;
  string local_28;
  
  checkTessellationSupport(ctx);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,"GL_INVALID_ENUM is generated if pname is not GL_PATCH_VERTICES.",
             (allocator<char> *)&maxPatchVertices);
  NegativeTestContext::beginSection(ctx,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  glu::CallLogWrapper::glPatchParameteri(&ctx->super_CallLogWrapper,0xffffffff,1);
  NegativeTestContext::expectError(ctx,0x500);
  NegativeTestContext::endSection(ctx);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,
             "GL_INVALID_VALUE is generated if value is less than or equal to zero.",
             (allocator<char> *)&maxPatchVertices);
  NegativeTestContext::beginSection(ctx,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  glu::CallLogWrapper::glPatchParameteri(&ctx->super_CallLogWrapper,0x8e72,0);
  NegativeTestContext::expectError(ctx,0x501);
  NegativeTestContext::endSection(ctx);
  maxPatchVertices = 0;
  glu::CallLogWrapper::glGetIntegerv(&ctx->super_CallLogWrapper,0x8e7d,&maxPatchVertices);
  NegativeTestContext::expectError(ctx,0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,
             "GL_INVALID_VALUE is generated if value is greater than GL_MAX_PATCH_VERTICES.",
             &local_29);
  NegativeTestContext::beginSection(ctx,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  glu::CallLogWrapper::glPatchParameteri(&ctx->super_CallLogWrapper,0x8e72,maxPatchVertices + 1);
  NegativeTestContext::expectError(ctx,0x501);
  NegativeTestContext::endSection(ctx);
  return;
}

Assistant:

void invalid_patch_parameteri (NegativeTestContext& ctx)
{
	checkTessellationSupport(ctx);

	ctx.beginSection("GL_INVALID_ENUM is generated if pname is not GL_PATCH_VERTICES.");
	ctx.glPatchParameteri(-1, 1);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_VALUE is generated if value is less than or equal to zero.");
	ctx.glPatchParameteri(GL_PATCH_VERTICES, 0);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();

	int maxPatchVertices= 0;
	ctx.glGetIntegerv(GL_MAX_PATCH_VERTICES, &maxPatchVertices);
	ctx.expectError(GL_NO_ERROR);

	ctx.beginSection("GL_INVALID_VALUE is generated if value is greater than GL_MAX_PATCH_VERTICES.");
	ctx.glPatchParameteri(GL_PATCH_VERTICES, maxPatchVertices + 1);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();
}